

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::ProgramPipelines::DefaultsTest::testProgramPipelineInfoLog
          (DefaultsTest *this,GLchar *expected_value)

{
  deUint32 err;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_1340;
  MessageBuilder local_11b0;
  int local_102c;
  char local_1028 [4];
  GLsizei log_size;
  GLchar log [4096];
  Functions *gl;
  GLchar *expected_value_local;
  DefaultsTest *this_local;
  
  gl = (Functions *)expected_value;
  expected_value_local = (GLchar *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  log._4088_4_ = (*pRVar2->_vptr_RenderContext[3])();
  log._4092_4_ = extraout_var;
  memset(local_1028,0,0x1000);
  local_102c = 0;
  (**(code **)(log._4088_8_ + 0x998))(this->m_program_pipeline_dsa,0x1000,&local_102c,local_1028);
  err = (**(code **)(log._4088_8_ + 0x800))();
  glu::checkError(err,"glGetProgramPipelineInfoLog have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                  ,0x157);
  if (gl == (Functions *)0x0) {
    if (local_102c == 0) {
      this_local._7_1_ = true;
    }
    else {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_11b0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_11b0,
                          (char (*) [69])
                          "glGetProgramPipelineInfoLog returned unexpectedly non-empty string: ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4096])local_1028);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b6cb9a);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_11b0);
      this_local._7_1_ = false;
    }
  }
  else {
    iVar1 = strcmp(local_1028,(char *)gl);
    if (iVar1 == 0) {
      this_local._7_1_ = true;
    }
    else {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_1340,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_1340,(char (*) [46])"glGetProgramPipelineInfoLog returned string: "
                         );
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4096])local_1028);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [36])", but is not the same as expected: ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)&gl);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b6cb9a);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1340);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DefaultsTest::testProgramPipelineInfoLog(glw::GLchar* expected_value)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Comparison limit. */
	static const glw::GLsizei max_log_size = 4096;

	/* Storage for data. */
	glw::GLchar log[max_log_size] = { 0 };

	/* Storage fetched length. */
	glw::GLsizei log_size = 0;

	/* Fetch. */
	gl.getProgramPipelineInfoLog(m_program_pipeline_dsa, max_log_size, &log_size, log);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineInfoLog have failed");

	/* Comparison. */
	if (DE_NULL == expected_value)
	{
		if (0 != log_size)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetProgramPipelineInfoLog returned unexpectedly non-empty string: " << log << "."
				<< tcu::TestLog::EndMessage;

			return false;
		}

		return true;
	}

	if (0 != strcmp(log, expected_value))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glGetProgramPipelineInfoLog returned string: " << log
			<< ", but is not the same as expected: " << expected_value << "." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}